

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::output_example(vw *all,example *ec,bool *hit_loss,multi_ex *ec_seq,ldf *data)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  _Ios_Openmode _Var4;
  size_type sVar5;
  reference ppeVar6;
  wclass *pwVar7;
  ulong uVar8;
  size_t sVar9;
  int **ppiVar10;
  ostream *poVar11;
  vector<example_*,_std::allocator<example_*>_> *in_RCX;
  byte *in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_R8;
  size_t i;
  stringstream outputStringStream;
  string outputString;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  size_t j;
  example *ec_k;
  size_t k;
  float min_score;
  uint32_t predicted_K;
  size_t K;
  size_t start_K;
  uint32_t predicted_class;
  float loss;
  v_array<COST_SENSITIVE::wclass> costs;
  label *ld;
  example *in_stack_fffffffffffffca8;
  example *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 uVar12;
  float local_2e4;
  string local_2a8 [32];
  ulong local_288;
  stringstream local_270 [16];
  ostream local_260;
  string local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  example *ec_00;
  example *peVar13;
  undefined1 is_test;
  vw *all_00;
  ulong local_88;
  ulong local_78;
  float local_70;
  uint local_6c;
  ulong local_60;
  uint32_t local_58;
  float local_54;
  v_array<COST_SENSITIVE::wclass> local_50;
  undefined8 *local_30;
  long local_28;
  vector<example_*,_std::allocator<example_*>_> *local_20;
  byte *local_18;
  long local_10;
  long *local_8;
  
  local_30 = (undefined8 *)(in_RSI + 0x6828);
  local_50._begin = (wclass *)*local_30;
  local_50._end = *(wclass **)(in_RSI + 0x6830);
  local_50.end_array = *(wclass **)(in_RSI + 0x6838);
  local_50.erase_count = *(size_t *)(in_RSI + 0x6840);
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar3 = example_is_newline(in_stack_fffffffffffffca8);
  if (((iVar3 == 0) &&
      (bVar2 = COST_SENSITIVE::ec_is_example_header(in_stack_fffffffffffffcc8), !bVar2)) &&
     (bVar2 = ec_is_label_definition
                        ((example *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)),
     !bVar2)) {
    *(long *)(*local_8 + 0x10) = *(long *)(local_10 + 0x68a0) + *(long *)(*local_8 + 0x10);
    local_54 = 0.0;
    if ((*(byte *)(local_28 + 0xbb) & 1) == 0) {
      local_58 = *(uint32_t *)(local_10 + 0x6850);
    }
    else {
      sVar5 = std::vector<example_*,_std::allocator<example_*>_>::size(local_20);
      std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,0);
      bVar2 = COST_SENSITIVE::ec_is_example_header(in_stack_fffffffffffffcc8);
      local_60 = (ulong)bVar2;
      local_6c = (uint)bVar2;
      local_70 = 3.4028235e+38;
      for (local_78 = local_60; local_78 < sVar5; local_78 = local_78 + 1) {
        ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_78);
        if ((*ppeVar6)->partial_prediction < local_70) {
          local_70 = (*ppeVar6)->partial_prediction;
          local_6c = (uint)local_78;
        }
      }
      ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                          (local_20,(ulong)local_6c);
      pwVar7 = v_array<COST_SENSITIVE::wclass>::operator[]
                         ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar6)->l).simple,0);
      local_58 = pwVar7->class_index;
    }
    uVar8 = (*(code *)PTR_test_label_0047ccd0)(local_10 + 0x6828);
    if ((uVar8 & 1) == 0) {
      local_88 = 0;
      while ((sVar9 = v_array<COST_SENSITIVE::wclass>::size(&local_50), local_88 < sVar9 &&
             ((*local_18 & 1) == 0))) {
        pwVar7 = v_array<COST_SENSITIVE::wclass>::operator[](&local_50,local_88);
        if (local_58 == pwVar7->class_index) {
          pwVar7 = v_array<COST_SENSITIVE::wclass>::operator[](&local_50,local_88);
          local_54 = pwVar7->x;
          *local_18 = 1;
        }
        local_88 = local_88 + 1;
      }
      *(double *)(*local_8 + 0x40) = (double)local_54 + *(double *)(*local_8 + 0x40);
      *(double *)(*local_8 + 0x48) = (double)local_54 + *(double *)(*local_8 + 0x48);
    }
    all_00 = (vw *)(local_8 + 0x6a2);
    ppiVar10 = v_array<int>::begin((v_array<int> *)all_00);
    peVar13 = (example *)*ppiVar10;
    ppiVar10 = v_array<int>::end((v_array<int> *)all_00);
    ec_00 = (example *)*ppiVar10;
    for (; peVar13 != ec_00;
        peVar13 = (example *)((long)&(peVar13->super_example_predict).indices._begin + 4)) {
      in_stack_ffffffffffffff5c = *(int *)&(peVar13->super_example_predict).indices._begin;
      if ((*(byte *)(local_28 + 0xbb) & 1) == 0) {
        local_2e4 = (float)*(uint *)(local_10 + 0x6850);
      }
      else {
        local_2e4 = *(float *)(local_10 + 0x6850);
      }
      local_c8 = *(undefined8 *)(local_10 + 0x6878);
      local_c0 = *(undefined8 *)(local_10 + 0x6880);
      local_b8 = *(undefined8 *)(local_10 + 0x6888);
      in_stack_ffffffffffffff50 = *(undefined8 *)(local_10 + 0x6890);
      (*(code *)local_8[0x6a7])(local_2e4,0,in_stack_ffffffffffffff5c);
    }
    if (0 < (int)local_8[0x6a6]) {
      std::__cxx11::string::string(local_e8);
      _Var4 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_270,local_e8,_Var4);
      for (local_288 = 0; uVar8 = local_288,
          sVar9 = v_array<COST_SENSITIVE::wclass>::size(&local_50), uVar8 < sVar9;
          local_288 = local_288 + 1) {
        if (local_288 != 0) {
          std::operator<<(&local_260,' ');
        }
        pwVar7 = v_array<COST_SENSITIVE::wclass>::operator[](&local_50,local_288);
        poVar11 = (ostream *)std::ostream::operator<<(&local_260,pwVar7->class_index);
        poVar11 = std::operator<<(poVar11,':');
        pwVar7 = v_array<COST_SENSITIVE::wclass>::operator[](&local_50,local_288);
        std::ostream::operator<<(poVar11,pwVar7->partial_prediction);
      }
      pcVar1 = (code *)local_8[0x6a8];
      uVar12 = (undefined4)local_8[0x6a6];
      std::__cxx11::stringstream::str();
      (*pcVar1)(uVar12,local_2a8);
      std::__cxx11::string::~string(local_2a8);
      std::__cxx11::stringstream::~stringstream(local_270);
      std::__cxx11::string::~string(local_e8);
    }
    is_test = (undefined1)((ulong)peVar13 >> 0x38);
    (*(code *)PTR_test_label_0047ccd0)(local_10 + 0x6828);
    COST_SENSITIVE::print_update
              (all_00,(bool)is_test,ec_00,
               (multi_ex *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0),(uint32_t)in_stack_ffffffffffffff50
              );
  }
  return;
}

Assistant:

void output_example(vw& all, example& ec, bool& hit_loss, multi_ex* ec_seq, ldf& data)
{
  label& ld = ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(ec))
    return;
  if (ec_is_example_header(ec))
    return;
  if (ec_is_label_definition(ec))
    return;

  all.sd->total_features += ec.num_features;

  float loss = 0.;

  uint32_t predicted_class;
  if (data.is_probabilities)
  {
    // predicted_K was already computed in do_actual_learning(),
    // but we cannot store it in ec.pred union because we store ec.pred.prob there.
    // So we must compute it again.
    size_t start_K = 0;
    size_t K = ec_seq->size();
    if (ec_is_example_header(*(*ec_seq)[0]))
      start_K = 1;
    uint32_t predicted_K = (uint32_t)start_K;
    float min_score = FLT_MAX;
    for (size_t k = start_K; k < K; k++)
    {
      example* ec_k = (*ec_seq)[k];
      if (ec_k->partial_prediction < min_score)
      {
        min_score = ec_k->partial_prediction;
        predicted_K = (uint32_t)k;
      }
    }
    predicted_class = (*ec_seq)[predicted_K]->l.cs.costs[0].class_index;
  }
  else
    predicted_class = ec.pred.multiclass;

  if (!COST_SENSITIVE::cs_label.test_label(&ec.l))
  {
    for (size_t j = 0; j < costs.size(); j++)
    {
      if (hit_loss)
        break;
      if (predicted_class == costs[j].class_index)
      {
        loss = costs[j].x;
        hit_loss = true;
      }
    }

    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
  }

  for (int sink : all.final_prediction_sink)
    all.print(sink, data.is_probabilities ? ec.pred.prob : (float)ec.pred.multiclass, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    // outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&ec.l), ec, ec_seq, false, predicted_class);
}